

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_filter_by_ext.c
# Opt level: O0

int archive_write_set_format_filter_by_ext_def(archive *a,char *filename,char *def_ext)

{
  int local_2c;
  int format_state;
  int names_index;
  char *def_ext_local;
  char *filename_local;
  archive *a_local;
  
  local_2c = get_array_index(filename);
  if (local_2c < 0) {
    local_2c = get_array_index(def_ext);
  }
  if (local_2c < 0) {
    archive_set_error(a,0x16,"No such format \'%s\'",filename);
    a->state = 0x8000;
    a_local._4_4_ = -0x1e;
  }
  else {
    a_local._4_4_ = (*names[local_2c].format)(a);
    if (a_local._4_4_ == 0) {
      a_local._4_4_ = (*names[local_2c].filter)(a);
    }
  }
  return a_local._4_4_;
}

Assistant:

int
archive_write_set_format_filter_by_ext_def(struct archive *a, const char *filename, const char * def_ext)
{
  int names_index = get_array_index(filename);
  
  if (names_index < 0)
    names_index = get_array_index(def_ext);
  
  if (names_index >= 0)
  {  
    int format_state = (names[names_index].format)(a);
    if (format_state == ARCHIVE_OK)
      return ((names[names_index].filter)(a));
    else
      return format_state;
  }    

  archive_set_error(a, EINVAL, "No such format '%s'", filename);
  a->state = ARCHIVE_STATE_FATAL;
  return (ARCHIVE_FATAL);
}